

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# physical_union.cpp
# Opt level: O2

void __thiscall
duckdb::PhysicalUnion::BuildPipelines
          (PhysicalUnion *this,Pipeline *current,MetaPipeline *meta_pipeline)

{
  _Head_base<0UL,_duckdb::GlobalOperatorState_*,_false> _Var1;
  _Head_base<0UL,_duckdb::GlobalSinkState_*,_false> _Var2;
  bool bVar3;
  bool bVar4;
  int iVar5;
  optional_ptr<duckdb::PhysicalOperator,_true> oVar6;
  PhysicalOperator *pPVar7;
  Pipeline *dependant;
  reference pvVar8;
  ClientContext *context;
  MetaPipeline *last_child;
  byte bVar9;
  byte bVar10;
  byte order_matters;
  vector<std::reference_wrapper<duckdb::PhysicalOperator>,_true> *this_00;
  optional_ptr<duckdb::MetaPipeline,_true> last_child_ptr;
  vector<duckdb::shared_ptr<duckdb::Pipeline,_true>,_true> dependencies;
  optional_ptr<duckdb::PhysicalOperator,_true> sink;
  vector<duckdb::shared_ptr<duckdb::Pipeline,_true>,_std::allocator<duckdb::shared_ptr<duckdb::Pipeline,_true>_>_>
  local_48;
  
  _Var1._M_head_impl =
       (this->super_PhysicalOperator).op_state.
       super_unique_ptr<duckdb::GlobalOperatorState,_std::default_delete<duckdb::GlobalOperatorState>_>
       ._M_t.
       super___uniq_ptr_impl<duckdb::GlobalOperatorState,_std::default_delete<duckdb::GlobalOperatorState>_>
       ._M_t.
       super__Tuple_impl<0UL,_duckdb::GlobalOperatorState_*,_std::default_delete<duckdb::GlobalOperatorState>_>
       .super__Head_base<0UL,_duckdb::GlobalOperatorState_*,_false>._M_head_impl;
  (this->super_PhysicalOperator).op_state.
  super_unique_ptr<duckdb::GlobalOperatorState,_std::default_delete<duckdb::GlobalOperatorState>_>.
  _M_t.
  super___uniq_ptr_impl<duckdb::GlobalOperatorState,_std::default_delete<duckdb::GlobalOperatorState>_>
  ._M_t.
  super__Tuple_impl<0UL,_duckdb::GlobalOperatorState_*,_std::default_delete<duckdb::GlobalOperatorState>_>
  .super__Head_base<0UL,_duckdb::GlobalOperatorState_*,_false>._M_head_impl =
       (GlobalOperatorState *)0x0;
  if (_Var1._M_head_impl != (GlobalOperatorState *)0x0) {
    (*(_Var1._M_head_impl)->_vptr_GlobalOperatorState[1])();
  }
  _Var2._M_head_impl =
       (this->super_PhysicalOperator).sink_state.
       super_unique_ptr<duckdb::GlobalSinkState,_std::default_delete<duckdb::GlobalSinkState>_>._M_t
       .
       super___uniq_ptr_impl<duckdb::GlobalSinkState,_std::default_delete<duckdb::GlobalSinkState>_>
       ._M_t.
       super__Tuple_impl<0UL,_duckdb::GlobalSinkState_*,_std::default_delete<duckdb::GlobalSinkState>_>
       .super__Head_base<0UL,_duckdb::GlobalSinkState_*,_false>._M_head_impl;
  (this->super_PhysicalOperator).sink_state.
  super_unique_ptr<duckdb::GlobalSinkState,_std::default_delete<duckdb::GlobalSinkState>_>._M_t.
  super___uniq_ptr_impl<duckdb::GlobalSinkState,_std::default_delete<duckdb::GlobalSinkState>_>._M_t
  .super__Tuple_impl<0UL,_duckdb::GlobalSinkState_*,_std::default_delete<duckdb::GlobalSinkState>_>.
  super__Head_base<0UL,_duckdb::GlobalSinkState_*,_false>._M_head_impl = (GlobalSinkState *)0x0;
  if (_Var2._M_head_impl != (GlobalSinkState *)0x0) {
    (**(code **)((long)(_Var2._M_head_impl)->_vptr_GlobalSinkState + 8))();
  }
  oVar6 = MetaPipeline::GetSink(meta_pipeline);
  bVar4 = this->allow_out_of_order;
  sink.ptr = oVar6.ptr;
  bVar3 = Pipeline::IsOrderDependent(current);
  bVar9 = 1;
  order_matters = bVar4 ^ 1;
  if (bVar3) {
    order_matters = bVar9;
  }
  if (oVar6.ptr != (PhysicalOperator *)0x0) {
    pPVar7 = optional_ptr<duckdb::PhysicalOperator,_true>::operator->(&sink);
    iVar5 = (*pPVar7->_vptr_PhysicalOperator[0x24])(pPVar7);
    pPVar7 = optional_ptr<duckdb::PhysicalOperator,_true>::operator->(&sink);
    (*pPVar7->_vptr_PhysicalOperator[0x23])(&dependencies,pPVar7);
    if ((char)dependencies.
              super_vector<duckdb::shared_ptr<duckdb::Pipeline,_true>,_std::allocator<duckdb::shared_ptr<duckdb::Pipeline,_true>_>_>
              .
              super__Vector_base<duckdb::shared_ptr<duckdb::Pipeline,_true>,_std::allocator<duckdb::shared_ptr<duckdb::Pipeline,_true>_>_>
              ._M_impl.super__Vector_impl_data._M_start != '\0') {
      order_matters = bVar9;
    }
    bVar10 = order_matters;
    if ((char)iVar5 != '\0') {
      bVar10 = bVar9;
    }
    pPVar7 = optional_ptr<duckdb::PhysicalOperator,_true>::operator->(&sink);
    iVar5 = (*pPVar7->_vptr_PhysicalOperator[0x22])(pPVar7);
    order_matters = bVar9;
    if ((char)iVar5 != '\0') {
      order_matters = bVar10;
    }
    ::std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
              ((_Vector_base<unsigned_long,_std::allocator<unsigned_long>_> *)
               &dependencies.
                super_vector<duckdb::shared_ptr<duckdb::Pipeline,_true>,_std::allocator<duckdb::shared_ptr<duckdb::Pipeline,_true>_>_>
                .
                super__Vector_base<duckdb::shared_ptr<duckdb::Pipeline,_true>,_std::allocator<duckdb::shared_ptr<duckdb::Pipeline,_true>_>_>
                ._M_impl.super__Vector_impl_data._M_finish);
  }
  dependant = MetaPipeline::CreateUnionPipeline(meta_pipeline,current,(bool)order_matters);
  this_00 = &(this->super_PhysicalOperator).children;
  pvVar8 = vector<std::reference_wrapper<duckdb::PhysicalOperator>,_true>::get<true>(this_00,0);
  (*pvVar8->_M_data->_vptr_PhysicalOperator[0x26])(pvVar8->_M_data,current,meta_pipeline);
  dependencies.
  super_vector<duckdb::shared_ptr<duckdb::Pipeline,_true>,_std::allocator<duckdb::shared_ptr<duckdb::Pipeline,_true>_>_>
  .
  super__Vector_base<duckdb::shared_ptr<duckdb::Pipeline,_true>,_std::allocator<duckdb::shared_ptr<duckdb::Pipeline,_true>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  dependencies.
  super_vector<duckdb::shared_ptr<duckdb::Pipeline,_true>,_std::allocator<duckdb::shared_ptr<duckdb::Pipeline,_true>_>_>
  .
  super__Vector_base<duckdb::shared_ptr<duckdb::Pipeline,_true>,_std::allocator<duckdb::shared_ptr<duckdb::Pipeline,_true>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  dependencies.
  super_vector<duckdb::shared_ptr<duckdb::Pipeline,_true>,_std::allocator<duckdb::shared_ptr<duckdb::Pipeline,_true>_>_>
  .
  super__Vector_base<duckdb::shared_ptr<duckdb::Pipeline,_true>,_std::allocator<duckdb::shared_ptr<duckdb::Pipeline,_true>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  last_child_ptr.ptr = (MetaPipeline *)0x0;
  pvVar8 = vector<std::reference_wrapper<duckdb::PhysicalOperator>,_true>::get<true>(this_00,0);
  bVar4 = ContainsSink(pvVar8->_M_data);
  if (bVar4) {
    pvVar8 = vector<std::reference_wrapper<duckdb::PhysicalOperator>,_true>::get<true>(this_00,0);
    pPVar7 = pvVar8->_M_data;
    context = Pipeline::GetClientContext(current);
    bVar4 = PhysicalOperator::CanSaturateThreads(pPVar7,context);
  }
  else {
    bVar4 = false;
  }
  bVar3 = true;
  if ((bVar4 != false) || ((bool)order_matters != false)) {
    MetaPipeline::AddDependenciesFrom
              ((vector<duckdb::shared_ptr<duckdb::Pipeline,_true>,_true> *)&local_48,meta_pipeline,
               dependant,dependant,false);
    ::std::
    vector<duckdb::shared_ptr<duckdb::Pipeline,_true>,_std::allocator<duckdb::shared_ptr<duckdb::Pipeline,_true>_>_>
    ::_M_move_assign(&dependencies.
                      super_vector<duckdb::shared_ptr<duckdb::Pipeline,_true>,_std::allocator<duckdb::shared_ptr<duckdb::Pipeline,_true>_>_>
                     ,&local_48);
    ::std::
    vector<duckdb::shared_ptr<duckdb::Pipeline,_true>,_std::allocator<duckdb::shared_ptr<duckdb::Pipeline,_true>_>_>
    ::~vector(&local_48);
    if (bVar4 != false) {
      last_child_ptr.ptr = MetaPipeline::GetLastChild(meta_pipeline);
      bVar3 = false;
    }
  }
  pvVar8 = vector<std::reference_wrapper<duckdb::PhysicalOperator>,_true>::get<true>(this_00,1);
  (*pvVar8->_M_data->_vptr_PhysicalOperator[0x26])(pvVar8->_M_data,dependant,meta_pipeline);
  if (!bVar3) {
    last_child = optional_ptr<duckdb::MetaPipeline,_true>::operator*(&last_child_ptr);
    MetaPipeline::AddRecursiveDependencies(meta_pipeline,&dependencies,last_child);
  }
  MetaPipeline::AssignNextBatchIndex(meta_pipeline,dependant);
  ::std::
  vector<duckdb::shared_ptr<duckdb::Pipeline,_true>,_std::allocator<duckdb::shared_ptr<duckdb::Pipeline,_true>_>_>
  ::~vector(&dependencies.
             super_vector<duckdb::shared_ptr<duckdb::Pipeline,_true>,_std::allocator<duckdb::shared_ptr<duckdb::Pipeline,_true>_>_>
           );
  return;
}

Assistant:

void PhysicalUnion::BuildPipelines(Pipeline &current, MetaPipeline &meta_pipeline) {
	op_state.reset();
	sink_state.reset();

	// order matters if any of the downstream operators are order dependent,
	// or if the sink preserves order, but does not support batch indices to do so
	auto sink = meta_pipeline.GetSink();
	bool order_matters = false;
	if (!allow_out_of_order) {
		order_matters = true;
	}
	if (current.IsOrderDependent()) {
		order_matters = true;
	}
	if (sink) {
		if (sink->SinkOrderDependent()) {
			order_matters = true;
		}
		auto partition_info = sink->RequiredPartitionInfo();
		if (partition_info.batch_index) {
			order_matters = true;
		}
		if (!sink->ParallelSink()) {
			order_matters = true;
		}
	}

	// create a union pipeline that has identical dependencies to 'current'
	auto &union_pipeline = meta_pipeline.CreateUnionPipeline(current, order_matters);

	// continue with the current pipeline
	children[0].get().BuildPipelines(current, meta_pipeline);

	vector<shared_ptr<Pipeline>> dependencies;
	optional_ptr<MetaPipeline> last_child_ptr;
	// users commonly UNION ALL together a bunch of cheap scan pipelines (e.g., instead of a multi file list)
	// in these cases, we don't want to avoid breadth-first plan evaluation,
	// as it doesn't pose a threat to memory usage (it's just a bunch of straight scans)
	const auto can_saturate_threads =
	    ContainsSink(children[0]) && children[0].get().CanSaturateThreads(current.GetClientContext());
	if (order_matters || can_saturate_threads) {
		// we add dependencies if order matters: union_pipeline comes after all pipelines created by building current
		dependencies = meta_pipeline.AddDependenciesFrom(union_pipeline, union_pipeline, false);
		// we also add dependencies if the LHS child can saturate all available threads
		// in that case, we recursively make all RHS children depend on the LHS.
		// This prevents breadth-first plan evaluation
		if (can_saturate_threads) {
			last_child_ptr = meta_pipeline.GetLastChild();
		}
	}

	// build the union pipeline
	children[1].get().BuildPipelines(union_pipeline, meta_pipeline);

	if (last_child_ptr) {
		// the pointer was set, set up the dependencies
		meta_pipeline.AddRecursiveDependencies(dependencies, *last_child_ptr);
	}

	// Assign proper batch index to the union pipeline
	// This needs to happen after the pipelines have been built because unions can be nested
	meta_pipeline.AssignNextBatchIndex(union_pipeline);
}